

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clique.cc
# Opt level: O2

SearchResult __thiscall
anon_unknown.dwarf_299ed3::CliqueRunner::expand<false>
          (CliqueRunner *this,int depth,unsigned_long_long *nodes,unsigned_long_long *find_nodes,
          unsigned_long_long *prove_nodes,vector<int,_std::allocator<int>_> *c,SVOBitset *p,
          conditional_t<false,_const_SVOBitset_&,_int> a,int spacepos)

{
  Incumbent *this_00;
  pointer *ppiVar1;
  ColourClassOrder CVar2;
  undefined4 uVar3;
  int *piVar4;
  pointer plVar5;
  Proof *pPVar6;
  vector<int,_std::allocator<int>_> *pvVar7;
  int *piVar8;
  int *piVar9;
  pointer __first;
  bool bVar10;
  int __tmp;
  uint uVar11;
  int iVar12;
  int iVar13;
  SearchResult SVar14;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var15;
  CliqueParams *pCVar16;
  byte bVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i;
  ulong uVar21;
  long lVar22;
  _Self __tmp_1;
  const_iterator __position;
  long lVar23;
  int *piVar24;
  _List_node_base *p_Var25;
  int v_1;
  _List_node_base *p_Var26;
  ulong uVar27;
  int in_stack_fffffffffffffdd8;
  uint local_20c;
  vector<int,_std::allocator<int>_> *local_208;
  undefined8 local_200;
  ulong local_1f8;
  ulong local_1f0;
  int *local_1e8;
  int *local_1e0;
  SearchResult local_1d4;
  unsigned_long_long *local_1d0;
  unsigned_long_long *local_1c8;
  ulong local_1c0;
  vector<int,_std::allocator<int>_> p_order_prelim;
  vector<int,_std::allocator<int>_> colour_sizes;
  SVOBitset p_left;
  vector<int,_std::allocator<int>_> sorted_order;
  vector<int,_std::allocator<int>_> colour_start;
  anon_union_128_2_84168a9f_for__data local_b8;
  
  *nodes = *nodes + 1;
  *prove_nodes = *prove_nodes + 1;
  piVar4 = this->space;
  piVar24 = piVar4 + a;
  local_20c = 0;
  local_1e8 = piVar4 + (this->size + a);
  CVar2 = this->params->colour_class_order;
  local_208 = c;
  local_1e0 = piVar24;
  local_1d0 = find_nodes;
  local_1c8 = prove_nodes;
  if (CVar2 == Sorted) {
    gss::innards::SVOBitset::SVOBitset(&p_left,p);
    local_20c = 0;
    std::vector<int,_std::allocator<int>_>::vector
              (&p_order_prelim,(long)this->size,(allocator_type *)&local_b8);
    std::vector<int,_std::allocator<int>_>::vector
              (&colour_sizes,(long)this->size,(allocator_type *)&local_b8);
    std::vector<int,_std::allocator<int>_>::vector
              (&colour_start,(long)this->size,(allocator_type *)&local_b8);
    std::vector<int,_std::allocator<int>_>::vector
              (&sorted_order,(long)this->size,(allocator_type *)&local_b8);
    uVar27 = 0;
    local_200 = (_List_node_base *)((ulong)local_200._4_4_ << 0x20);
    while( true ) {
      bVar10 = gss::innards::SVOBitset::any(&p_left);
      __first = sorted_order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar19 = (uint)local_200;
      uVar20 = (ulong)local_200 & 0xffffffff;
      uVar11 = (uint)uVar27;
      if (!bVar10) break;
      colour_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar20] = uVar11;
      colour_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar20] = 0;
      gss::innards::SVOBitset::SVOBitset((SVOBitset *)&local_b8,&p_left);
      local_200 = (_List_node_base *)CONCAT44(local_200._4_4_,(uint)local_200 + 1);
      uVar27 = (ulong)(int)uVar11;
      while (bVar10 = gss::innards::SVOBitset::any((SVOBitset *)&local_b8), bVar10) {
        uVar19 = gss::innards::SVOBitset::find_first((SVOBitset *)&local_b8);
        gss::innards::SVOBitset::reset(&p_left,uVar19);
        gss::innards::SVOBitset::reset((SVOBitset *)&local_b8,uVar19);
        gss::innards::SVOBitset::intersect_with_complement
                  ((SVOBitset *)&local_b8,
                   (this->adj).
                   super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                   ._M_impl.super__Vector_impl_data._M_start + (int)uVar19);
        *(uint *)(CONCAT44(p_order_prelim.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           (int)p_order_prelim.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                .super__Vector_impl_data._M_start) + uVar27 * 4) = uVar19;
        uVar27 = uVar27 + 1;
        colour_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar20] =
             colour_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar20] + 1;
      }
      gss::innards::SVOBitset::~SVOBitset((SVOBitset *)&local_b8);
    }
    lVar18 = 0;
    _Var15._M_current =
         sorted_order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start + uVar20;
    for (lVar23 = uVar20 * 4; lVar23 != 0; lVar23 = lVar23 + -4) {
      sorted_order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar18] = (int)lVar18;
      lVar18 = lVar18 + 1;
    }
    local_20c = uVar11;
    local_1f8 = uVar27;
    if ((uint)local_200 != 0) {
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::CliqueRunner::colour_class_order_sorted(gss::innards::SVOBitset_const&,int*,int*,int&)::_lambda(int,int)_1_>>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 sorted_order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,_Var15,
                 (ulong)(uint)((int)LZCOUNT(uVar20) * 2) ^ 0x7e,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ciaranm[P]glasgow_subgraph_solver_gss_clique_cc:351:71)>
                  )&colour_sizes);
      if (uVar19 < 0x11) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::CliqueRunner::colour_class_order_sorted(gss::innards::SVOBitset_const&,int*,int*,int&)::_lambda(int,int)_1_>>
                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first,_Var15
                   ,(_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ciaranm[P]glasgow_subgraph_solver_gss_clique_cc:351:71)>
                     )&colour_sizes);
      }
      else {
        _Var15._M_current = __first + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::CliqueRunner::colour_class_order_sorted(gss::innards::SVOBitset_const&,int*,int*,int&)::_lambda(int,int)_1_>>
                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first,_Var15
                   ,(_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ciaranm[P]glasgow_subgraph_solver_gss_clique_cc:351:71)>
                     )&colour_sizes);
        for (lVar23 = uVar20 * 4 + -0x40; lVar23 != 0; lVar23 = lVar23 + -4) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Val_comp_iter<(anonymous_namespace)::CliqueRunner::colour_class_order_sorted(gss::innards::SVOBitset_const&,int*,int*,int&)::_lambda(int,int)_1_>>
                    (_Var15,(_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ciaranm[P]glasgow_subgraph_solver_gss_clique_cc:351:71)>
                             )&colour_sizes);
          _Var15._M_current = _Var15._M_current + 1;
        }
      }
    }
    piVar24 = local_1e0;
    lVar23 = 0;
    uVar27 = 0;
    while (uVar21 = uVar27, uVar21 != uVar20) {
      lVar22 = (long)sorted_order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar21];
      lVar23 = (long)(int)lVar23;
      iVar12 = colour_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar22];
      for (lVar18 = (long)iVar12; uVar27 = uVar21 + 1,
          lVar18 < (long)iVar12 +
                   (long)colour_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[(int)lVar22]; lVar18 = lVar18 + 1) {
        local_1e8[lVar23] = (int)(uVar21 + 1);
        local_1e0[lVar23] =
             *(int *)(CONCAT44(p_order_prelim.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,
                               (int)p_order_prelim.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start) + lVar18 * 4);
        lVar23 = lVar23 + 1;
        lVar22 = (long)sorted_order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar21];
        iVar12 = colour_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar22];
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&sorted_order.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&colour_start.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&colour_sizes.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&p_order_prelim.super__Vector_base<int,_std::allocator<int>_>);
    gss::innards::SVOBitset::~SVOBitset(&p_left);
    c = local_208;
    uVar27 = local_1f8;
  }
  else if (CVar2 == SingletonsFirst) {
    iVar12 = a + this->size * 2;
    gss::innards::SVOBitset::SVOBitset(&p_left,p);
    uVar20 = 0;
    uVar27 = 0;
    local_200 = (_List_node_base *)((ulong)local_200 & 0xffffffff00000000);
    while( true ) {
      bVar10 = gss::innards::SVOBitset::any(&p_left);
      c = local_208;
      local_1f0 = (ulong)local_200 & 0xffffffff;
      iVar13 = (int)uVar20;
      local_1f8 = uVar20;
      if (!bVar10) break;
      gss::innards::SVOBitset::SVOBitset((SVOBitset *)&local_b8,&p_left);
      piVar8 = local_1e8;
      uVar19 = (int)uVar27 + 1;
      lVar23 = 0;
      local_1c0 = uVar27;
      while (bVar10 = gss::innards::SVOBitset::any((SVOBitset *)&local_b8), piVar9 = local_1e0,
            bVar10) {
        uVar11 = gss::innards::SVOBitset::find_first((SVOBitset *)&local_b8);
        gss::innards::SVOBitset::reset(&p_left,uVar11);
        gss::innards::SVOBitset::reset((SVOBitset *)&local_b8,uVar11);
        gss::innards::SVOBitset::intersect_with_complement
                  ((SVOBitset *)&local_b8,
                   (this->adj).
                   super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                   ._M_impl.super__Vector_impl_data._M_start + (int)uVar11);
        piVar8[iVar13 + lVar23] = uVar19;
        piVar24[iVar13 + lVar23] = uVar11;
        lVar23 = lVar23 + 1;
      }
      if ((int)lVar23 == 1) {
        local_200 = (_List_node_base *)CONCAT44(local_200._4_4_,(uint)local_200 + 1);
        uVar20 = local_1f8 & 0xffffffff;
        piVar4[(long)iVar12 + local_1f0] = local_1e0[(int)local_1f8];
        uVar27 = local_1c0;
      }
      else {
        uVar27 = (ulong)uVar19;
        uVar20 = (local_1f8 & 0xffffffff) + lVar23;
      }
      gss::innards::SVOBitset::~SVOBitset((SVOBitset *)&local_b8);
      piVar24 = piVar9;
    }
    for (uVar20 = 0; local_1f0 != uVar20; uVar20 = uVar20 + 1) {
      piVar24[(long)iVar13 + uVar20] = piVar4[(long)iVar12 + uVar20];
      local_1e8[(long)iVar13 + uVar20] = (int)uVar27 + 1 + (int)uVar20;
    }
    local_20c = iVar13 + (int)uVar20;
    uVar27 = (ulong)local_20c;
    gss::innards::SVOBitset::~SVOBitset(&p_left);
  }
  else {
    uVar27 = 0;
    if (CVar2 == ColourOrder) {
      colour_class_order(this,p,piVar24,local_1e8,(int *)&local_20c);
      uVar27 = (ulong)local_20c;
    }
  }
  this_00 = &this->incumbent;
  iVar12 = depth + 1;
  local_1f0 = uVar27 & 0xffffffff;
  while( true ) {
    if ((int)local_1f0 < 1) goto LAB_00157087;
    bVar10 = gss::Timeout::should_abort
                       ((this->params->timeout).
                        super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (bVar10) {
      return Aborted;
    }
    uVar27 = local_1f0 - 1;
    if ((ulong)(((long)(c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 2) + (long)local_1e8[uVar27]) <=
        (ulong)this_00->value) {
      if ((this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0) {
        p_left._data.short_data[2] = 0;
        p_left._data.short_data[0] = 0;
        p_left._data.short_data[1] = 0;
        for (uVar27 = 0; local_1f0 != uVar27; uVar27 = uVar27 + 1) {
          if ((uVar27 == 0) || (local_1e8[uVar27 - 1] != local_1e8[uVar27])) {
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::emplace_back<>((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              *)&p_left);
          }
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)(p_left._data.short_data[1] - 0x18),
                     (this->order).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + piVar24[uVar27]);
        }
        gss::innards::Proof::colour_bound
                  ((this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,(vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            *)&p_left);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)&p_left);
      }
      goto LAB_00157087;
    }
    if (local_1f0 == (uint)local_1e8[uVar27]) break;
    p_order_prelim.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = piVar24[uVar27];
    local_1c0 = uVar27;
    std::vector<int,_std::allocator<int>_>::push_back(c,(value_type_conflict1 *)&p_order_prelim);
    pCVar16 = this->params;
    if ((pCVar16->decide).super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged == false) {
      bVar17 = (pCVar16->stop_after_finding).super__Optional_base<unsigned_int,_true,_true>.
               _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged;
      if ((bool)bVar17 != false) goto LAB_00156b07;
      pPVar6 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (((pPVar6 != (Proof *)0x0) &&
          ((ulong)this_00->value <
           (ulong)((long)(c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 2))) &&
         (pCVar16->proof_is_for_hom == false)) {
        gss::innards::Proof::start_level(pPVar6,0);
        pPVar6 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        unpermute_and_finish
                  ((vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)&p_left,
                   this,c);
        gss::innards::Proof::new_incumbent
                  (pPVar6,(vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
                          &p_left);
        std::_Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::
        ~_Vector_base((_Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
                      &p_left);
        gss::innards::Proof::start_level
                  ((this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,iVar12);
      }
      Incumbent::update(this_00,c,local_1d0,local_1c8);
    }
    else {
      if ((pCVar16->decide).super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload._M_value <= this_00->value)
      goto LAB_00156fcb;
      bVar17 = (pCVar16->stop_after_finding).super__Optional_base<unsigned_int,_true,_true>.
               _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged;
LAB_00156b07:
      if (((bVar17 & 1) != 0) &&
         ((pCVar16->stop_after_finding).super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload._M_value <= this_00->value)) {
LAB_00156fcb:
        pPVar6 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (pPVar6 != (Proof *)0x0) {
          unpermute((vector<int,_std::allocator<int>_> *)&p_left,this,c);
          gss::innards::Proof::post_solution(pPVar6,(vector<int,_std::allocator<int>_> *)&p_left);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&p_left);
        }
        return DecidedTrue;
      }
    }
    gss::innards::SVOBitset::SVOBitset(&p_left,p);
    gss::innards::SVOBitset::operator&=
              (&p_left,(this->adj).
                       super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                       (int)p_order_prelim.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    iVar13 = (*((this->params->restarts_schedule)._M_t.
                super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
                ._M_t.
                super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>
                .super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl)->
               _vptr_RestartsSchedule[5])();
    if ((char)iVar13 != '\0') {
      local_1f8 = (ulong)(int)p_order_prelim.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start;
      plVar5 = (this->watches).table.data.
               super__Vector_base<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_200 = (_List_node_base *)(plVar5 + local_1f8);
      __position._M_node =
           *(_List_node_base **)
            &plVar5[local_1f8].
             super__List_base<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
             ._M_impl;
      p_Var26 = local_200;
LAB_00156c17:
      if (__position._M_node != p_Var26) {
        p_Var26 = __position._M_node[1]._M_next;
        p_Var25 = p_Var26[1]._M_next;
        iVar13 = *(int *)&p_Var25->_M_next;
        if (iVar13 != (int)local_1f8) {
          *(undefined4 *)&p_Var25->_M_next = *(undefined4 *)((long)&p_Var25->_M_next + 4);
          *(int *)((long)&p_Var25->_M_next + 4) = iVar13;
        }
        for (p_Var25 = (_List_node_base *)&p_Var25->_M_prev; p_Var25 != p_Var26[1]._M_prev;
            p_Var25 = (_List_node_base *)((long)&p_Var25->_M_next + 4)) {
          local_b8.short_data[0]._0_4_ = *(undefined4 *)&p_Var25->_M_next;
          piVar24 = (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
          _Var15 = std::
                   __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                             ((c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start,piVar24,&local_b8);
          if (piVar24 == _Var15._M_current) {
            p_Var26 = p_Var26[1]._M_next;
            uVar3 = *(undefined4 *)&p_Var26->_M_next;
            *(undefined4 *)&p_Var26->_M_next = *(undefined4 *)&p_Var25->_M_next;
            *(undefined4 *)&p_Var25->_M_next = uVar3;
            std::__cxx11::
            list<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
            ::push_back((this->watches).table.data.
                        super__Vector_base<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + *(int *)&p_Var26->_M_next,
                        (value_type *)(__position._M_node + 1));
            p_Var26 = local_200;
            p_Var25 = (__position._M_node)->_M_next;
            std::__cxx11::
            list<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
            ::erase((list<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
                     *)local_200,__position);
            c = local_208;
            __position._M_node = p_Var25;
            piVar24 = local_1e0;
            goto LAB_00156c17;
          }
        }
        gss::innards::SVOBitset::reset(&p_left,*(int *)((long)&(p_Var26[1]._M_next)->_M_next + 4));
        __position._M_node = (__position._M_node)->_M_next;
        piVar24 = local_1e0;
        p_Var26 = local_200;
        goto LAB_00156c17;
      }
    }
    pPVar6 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (pPVar6 != (Proof *)0x0) {
      gss::innards::Proof::start_level(pPVar6,iVar12);
    }
    bVar10 = gss::innards::SVOBitset::any(&p_left);
    if (bVar10) {
      SVar14 = expand<false>(this,iVar12,nodes,local_1d0,local_1c8,local_208,&p_left,
                             a + this->size * 2,in_stack_fffffffffffffdd8);
      uVar27 = local_1f0;
      bVar10 = false;
      if (SVar14 != Aborted) {
        if (SVar14 == Restart) {
          ppiVar1 = &(local_208->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppiVar1 = *ppiVar1 + -1;
          uVar19 = local_20c;
          while (pvVar7 = local_208, (int)uVar27 < (int)uVar19) {
            uVar19 = uVar19 - 1;
            std::vector<int,_std::allocator<int>_>::push_back(local_208,piVar24 + uVar19);
            post_nogood(this,pvVar7);
            ppiVar1 = &(pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppiVar1 = *ppiVar1 + -1;
          }
          bVar10 = false;
          SVar14 = Restart;
        }
        else {
          bVar10 = false;
          if (SVar14 != DecidedTrue) goto LAB_00156d76;
        }
      }
    }
    else {
LAB_00156d76:
      pvVar7 = local_208;
      pPVar6 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (pPVar6 != (Proof *)0x0) {
        gss::innards::Proof::start_level(pPVar6,depth);
        pPVar6 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        unpermute((vector<int,_std::allocator<int>_> *)&local_b8,this,pvVar7);
        gss::innards::Proof::backtrack_from_binary_variables
                  (pPVar6,(vector<int,_std::allocator<int>_> *)&local_b8);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&local_b8);
        gss::innards::Proof::forget_level
                  ((this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,iVar12);
      }
      ppiVar1 = &(pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppiVar1 = *ppiVar1 + -1;
      gss::innards::SVOBitset::reset
                (p,(int)p_order_prelim.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      bVar10 = true;
      SVar14 = local_1d4;
    }
    gss::innards::SVOBitset::~SVOBitset(&p_left);
    local_1f0 = local_1c0;
    c = local_208;
    local_1d4 = SVar14;
    if (!bVar10) {
      return SVar14;
    }
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&p_left,c);
  for (; -1 < (int)uVar27; uVar27 = (ulong)((int)uVar27 - 1)) {
    std::vector<int,_std::allocator<int>_>::push_back(c,piVar24 + (uVar27 & 0xffffffff));
  }
  Incumbent::update(this_00,c,local_1d0,local_1c8);
  SVar14 = local_1d4;
  pCVar16 = this->params;
  pPVar6 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((pPVar6 != (Proof *)0x0) &&
     ((pCVar16->decide).super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged == false)) {
    gss::innards::Proof::start_level(pPVar6,0);
    pPVar6 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    unpermute_and_finish
              ((vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)&local_b8,
               this,c);
    gss::innards::Proof::new_incumbent
              (pPVar6,(vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
                      &local_b8);
    std::_Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::~_Vector_base
              ((_Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
               &local_b8);
    gss::innards::Proof::start_level
              ((this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,iVar12);
    pCVar16 = this->params;
  }
  if ((((pCVar16->decide).super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged == true) &&
      ((pCVar16->decide).super__Optional_base<unsigned_int,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_int>._M_payload._M_value <= this_00->value)) ||
     (((pCVar16->stop_after_finding).super__Optional_base<unsigned_int,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_int>._M_engaged == true &&
      ((pCVar16->stop_after_finding).super__Optional_base<unsigned_int,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_int>._M_payload._M_value <= this_00->value)))) {
    pPVar6 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    SVar14 = DecidedTrue;
    if (pPVar6 != (Proof *)0x0) {
      unpermute((vector<int,_std::allocator<int>_> *)&local_b8,this,c);
      gss::innards::Proof::post_solution(pPVar6,(vector<int,_std::allocator<int>_> *)&local_b8);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_b8);
    }
    bVar10 = false;
  }
  else {
    std::vector<int,_std::allocator<int>_>::_M_move_assign(c,&p_left);
    bVar10 = true;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&p_left);
  c = local_208;
  if (bVar10) {
LAB_00157087:
    (*((this->params->restarts_schedule)._M_t.
       super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>.
       _M_t.
       super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>.
       super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl)->_vptr_RestartsSchedule
      [2])();
    iVar12 = (*((this->params->restarts_schedule)._M_t.
                super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
                ._M_t.
                super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>
                .super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl)->
               _vptr_RestartsSchedule[4])();
    if ((char)iVar12 == '\0') {
      SVar14 = Complete;
    }
    else {
      post_nogood(this,c);
      SVar14 = Restart;
    }
  }
  return SVar14;
}

Assistant:

auto expand(
            int depth,
            unsigned long long & nodes,
            unsigned long long & find_nodes,
            unsigned long long & prove_nodes,
            vector<int> & c,
            SVOBitset & p,
            conditional_t<connected_, const SVOBitset &, int> a,
            int spacepos) -> SearchResult
        {
            ++nodes;
            ++prove_nodes;

            // initial colouring
            int * p_order = &space[spacepos];
            int * p_bounds = &space[spacepos + size];

            int p_end = 0;

            if constexpr (connected_) {
                if (! c.empty())
                    connected_colour_class_order(p, a, p_order, p_bounds, p_end);
                else
                    colour_class_order(p, p_order, p_bounds, p_end);
            }
            else {
                switch (params.colour_class_order) {
                case ColourClassOrder::ColourOrder: colour_class_order(p, p_order, p_bounds, p_end); break;
                case ColourClassOrder::SingletonsFirst: colour_class_order_2df(p, p_order, p_bounds, &space[spacepos + 2 * size], p_end); break;
                case ColourClassOrder::Sorted: colour_class_order_sorted(p, p_order, p_bounds, p_end); break;
                }
            }

            // for each v in p... (v comes later)
            for (int n = p_end - 1; n >= 0; --n) {
                // bound, timeout or early exit?
                if (params.timeout->should_abort())
                    return SearchResult::Aborted;

                if (c.size() + p_bounds[n] <= incumbent.value) {
                    if (proof) {
                        vector<vector<int>> colour_classes;
                        for (int v = 0; v <= n; ++v) {
                            if (0 == v || p_bounds[v - 1] != p_bounds[v])
                                colour_classes.emplace_back();
                            colour_classes.back().push_back(order[p_order[v]]);
                        }
                        proof->colour_bound(colour_classes);
                    }
                    break;
                }

                // if we've used k colours to colour k vertices, it's a clique. this isn't (I think?) a
                // valid shortcut in the connected case.
                if constexpr (! connected_) {
                    if (p_bounds[n] == n + 1) {
                        auto c_save = c;
                        for (; n >= 0; --n)
                            c.push_back(p_order[n]);
                        incumbent.update(c, find_nodes, prove_nodes);

                        if (proof && ! params.decide) {
                            proof->start_level(0);
                            proof->new_incumbent(unpermute_and_finish(c));
                            proof->start_level(depth + 1);
                        }

                        if ((params.decide && incumbent.value >= *params.decide) ||
                            (params.stop_after_finding && incumbent.value >= *params.stop_after_finding)) {
                            if (proof)
                                proof->post_solution(unpermute(c));

                            return SearchResult::DecidedTrue;
                        }

                        c = move(c_save);

                        break;
                    }
                }

                auto v = p_order[n];

                if constexpr (connected_) {
                    if ((! c.empty()) && (! a.test(v))) {
                        // none of the remaining vertices can give a connected underlying graph
                        if (proof) {
                            auto c_unpermuted = unpermute(c);
                            for (int v = 0; v <= n; ++v)
                                proof->not_connected_in_underlying_graph(unpermute(c), order[p_order[v]]);

                            proof->start_level(depth);
                            proof->backtrack_from_binary_variables(unpermute(c));
                            proof->forget_level(depth + 1);
                        }

                        break;
                    }
                }

                // consider taking v
                c.push_back(v);

                if (params.decide || params.stop_after_finding) {
                    if ((params.decide && incumbent.value >= *params.decide) ||
                        (params.stop_after_finding && incumbent.value >= *params.stop_after_finding)) {
                        if (proof)
                            proof->post_solution(unpermute(c));

                        return SearchResult::DecidedTrue;
                    }
                }
                else {
                    if (proof && c.size() > incumbent.value && ! params.proof_is_for_hom) {
                        proof->start_level(0);
                        proof->new_incumbent(unpermute_and_finish(c));
                        proof->start_level(depth + 1);
                    }
                    incumbent.update(c, find_nodes, prove_nodes);
                }

                // filter p to contain vertices adjacent to v
                SVOBitset new_p = p;
                new_p &= adj[v];

                if (params.restarts_schedule->might_restart())
                    watches.propagate(
                        v,
                        [&](int literal) { return c.end() == find(c.begin(), c.end(), literal); },
                        [&](int literal) { new_p.reset(literal); });

                if (proof)
                    proof->start_level(depth + 1);

                if (new_p.any()) {
                    auto new_a = a;

                    if constexpr (connected_) {
                        new_a |= connected_table[v];
                    }

                    switch (expand<connected_>(depth + 1, nodes, find_nodes, prove_nodes, c, new_p, new_a, spacepos + 2 * size)) {
                    case SearchResult::Aborted:
                        return SearchResult::Aborted;

                    case SearchResult::DecidedTrue:
                        return SearchResult::DecidedTrue;

                    case SearchResult::Complete:
                        break;

                    case SearchResult::Restart:
                        // restore assignments before posting nogoods, it's easier
                        c.pop_back();

                        // post nogoods for everything we've done so far
                        for (int m = p_end - 1; m > n; --m) {
                            c.push_back(p_order[m]);
                            post_nogood(c);
                            c.pop_back();
                        }

                        return SearchResult::Restart;
                    }
                }

                if (proof) {
                    proof->start_level(depth);
                    proof->backtrack_from_binary_variables(unpermute(c));
                    proof->forget_level(depth + 1);
                }

                // now consider not taking v
                c.pop_back();
                p.reset(v);
            }

            params.restarts_schedule->did_a_backtrack();
            if (params.restarts_schedule->should_restart()) {
                post_nogood(c);
                return SearchResult::Restart;
            }
            else
                return SearchResult::Complete;
        }